

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O1

void __thiscall StringTest::Test3(StringTest *this)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  string t1;
  string t2;
  string t4;
  string t3;
  long *local_b0;
  ulong local_a8;
  long local_a0 [2];
  long *local_90;
  ulong local_88;
  long local_80 [2];
  long *local_70;
  ulong local_68;
  long local_60 [2];
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"abc","");
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"def","");
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"abc","");
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"abcdef","");
  uVar5 = local_88;
  uVar1 = local_a8;
  uVar4 = local_a8;
  if (local_88 < local_a8) {
    uVar4 = local_88;
  }
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    uVar2 = memcmp(local_b0,local_90,uVar4);
    uVar4 = (ulong)uVar2;
  }
  if ((int)uVar4 == 0) {
    uVar4 = 0xffffffff80000000;
    if (-0x80000000 < (long)(uVar1 - uVar5)) {
      uVar4 = uVar1 - uVar5;
    }
    if (0x7ffffffe < (long)uVar4) {
      uVar4 = 0x7fffffff;
    }
  }
  if (-1 < (int)uVar4) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xc1,"t1 compare t2");
  }
  uVar5 = local_88;
  uVar1 = local_a8;
  uVar4 = local_88;
  if (local_a8 < local_88) {
    uVar4 = local_a8;
  }
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    uVar2 = memcmp(local_90,local_b0,uVar4);
    uVar4 = (ulong)uVar2;
  }
  if ((int)uVar4 == 0) {
    uVar4 = 0xffffffff80000000;
    if (-0x80000000 < (long)(uVar5 - uVar1)) {
      uVar4 = uVar5 - uVar1;
    }
    if (0x7ffffffe < (long)uVar4) {
      uVar4 = 0x7fffffff;
    }
  }
  if ((int)uVar4 < 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xc4,"t2 compare t1");
  }
  uVar5 = local_48;
  uVar1 = local_a8;
  uVar4 = local_a8;
  if (local_48 < local_a8) {
    uVar4 = local_48;
  }
  if (uVar4 == 0) {
    bVar6 = true;
  }
  else {
    iVar3 = bcmp(local_b0,local_50,uVar4);
    bVar6 = iVar3 == 0;
  }
  if (!(bool)(bVar6 & uVar1 == uVar5)) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,199,"t1 compare t3");
  }
  uVar5 = local_68;
  uVar1 = local_a8;
  uVar4 = local_a8;
  if (local_68 < local_a8) {
    uVar4 = local_68;
  }
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    uVar2 = memcmp(local_b0,local_70,uVar4);
    uVar4 = (ulong)uVar2;
  }
  if ((int)uVar4 == 0) {
    uVar4 = 0xffffffff80000000;
    if (-0x80000000 < (long)(uVar1 - uVar5)) {
      uVar4 = uVar1 - uVar5;
    }
    if (0x7ffffffe < (long)uVar4) {
      uVar4 = 0x7fffffff;
    }
  }
  if (-1 < (int)uVar4) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xca,"t1 compare t4");
  }
  uVar1 = local_a8;
  uVar5 = local_68;
  if (local_a8 < local_68) {
    uVar5 = local_a8;
  }
  if (uVar5 == 0) {
    uVar5 = 0;
  }
  else {
    uVar2 = memcmp(local_70,local_b0,uVar5);
    uVar5 = (ulong)uVar2;
  }
  if ((int)uVar5 == 0) {
    uVar5 = 0xffffffff80000000;
    if (-0x80000000 < (long)(local_68 - uVar1)) {
      uVar5 = local_68 - uVar1;
    }
    if (0x7ffffffe < (long)uVar5) {
      uVar5 = 0x7fffffff;
    }
  }
  if ((int)uVar5 < 1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xcd,"t4 compare t1");
  }
  if (local_a8 == local_48) {
    if (local_a8 != 0) {
      iVar3 = bcmp(local_b0,local_50,local_a8);
      if (iVar3 != 0) goto LAB_0010443f;
    }
  }
  else {
LAB_0010443f:
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xd0,"t1 != t3");
  }
  if (local_a8 == local_88) {
    if (local_a8 != 0) {
      iVar3 = bcmp(local_b0,local_90,local_a8);
      if (iVar3 != 0) goto LAB_0010449d;
    }
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xd3,"t1 == t2");
  }
LAB_0010449d:
  iVar3 = std::__cxx11::string::compare((char *)&local_b0);
  if (iVar3 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xd6,"t1 != abc");
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_b0);
  if (iVar3 == 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xd9,"t1 == def");
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_b0);
  if (iVar3 != 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xdc,"abc != t1");
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_b0);
  if (iVar3 == 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0xdf,"def == t1");
  }
  TestCase::TestPassed(&this->super_TestCase);
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  return;
}

Assistant:

void Test3()
	{
		string t1 = "abc";
		string t2 = "def";
		string t3 = "abc";
		string t4 = "abcdef";
		
		if ( t1.compare( t2 ) >= 0 )
			TestFailed( "t1 compare t2" );
		
		if ( t2.compare( t1 ) <= 0 )
			TestFailed( "t2 compare t1" );

		if ( t1.compare( t3 ) != 0 )
			TestFailed( "t1 compare t3" );

		if ( t1.compare( t4 ) >= 0 )
			TestFailed( "t1 compare t4" );

		if ( t4.compare( t1 ) <= 0 )
			TestFailed( "t4 compare t1" );

		if ( t1 != t3 )
			TestFailed( "t1 != t3" );

		if ( t1 == t2 )
			TestFailed( "t1 == t2" );

		if ( t1 != "abc" )
			TestFailed( "t1 != abc" );

		if ( t1 == "def" )
			TestFailed( "t1 == def" );

		if ( "abc" != t1 )
			TestFailed( "abc != t1" );

		if ( "def" == t1 )
			TestFailed( "def == t1" );
		
		TestPassed();
	}